

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  
  glfwSetErrorCallback(anon_unknown.dwarf_9e::errorCallback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    main_cold_3();
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    handle = glfwCreateWindow(0x500,0x2d0,"InitGL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      main_cold_2();
    }
    else {
      glfwMakeContextCurrent(handle);
      iVar1 = gladLoadGL();
      if (iVar1 == 0) {
        main_cold_1();
      }
      else {
        (*glad_glClearColor)(0.15,0.6,0.4,1.0);
        iVar1 = glfwWindowShouldClose(handle);
        while (iVar1 == 0) {
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwPollEvents();
          iVar1 = glfwWindowShouldClose(handle);
        }
        glfwDestroyWindow(handle);
        glfwTerminate();
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   glfwSetErrorCallback(errorCallback);

   GLFWwindow* window = initialize();
   if (!window) {
      return 0;
   }

   // Set the clear color to a nice green
   glClearColor(0.15f, 0.6f, 0.4f, 1.0f);

   while (!glfwWindowShouldClose(window)) {
      glClear(GL_COLOR_BUFFER_BIT);

      glfwSwapBuffers(window);
      glfwPollEvents();
   }

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}